

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O0

void __thiscall Pl_SHA2::resetBits(Pl_SHA2 *this,int bits)

{
  logic_error *this_00;
  element_type *peVar1;
  shared_ptr<QPDFCryptoImpl> local_38 [2];
  uint local_14;
  Pl_SHA2 *pPStack_10;
  int bits_local;
  Pl_SHA2 *this_local;
  
  local_14 = bits;
  pPStack_10 = this;
  if ((this->in_progress & 1U) != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"bit reset requested for in-progress SHA2 Pipeline");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  QPDFCryptoProvider::getImpl();
  std::shared_ptr<QPDFCryptoImpl>::operator=(&this->crypto,local_38);
  std::shared_ptr<QPDFCryptoImpl>::~shared_ptr(local_38);
  peVar1 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->crypto);
  (*peVar1->_vptr_QPDFCryptoImpl[7])(peVar1,(ulong)local_14);
  return;
}

Assistant:

void
Pl_SHA2::resetBits(int bits)
{
    if (this->in_progress) {
        throw std::logic_error("bit reset requested for in-progress SHA2 Pipeline");
    }
    this->crypto = QPDFCryptoProvider::getImpl();
    this->crypto->SHA2_init(bits);
}